

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall
cmFindPackageCommand::SetConfigDirCacheVariable(cmFindPackageCommand *this,string *value)

{
  string *name;
  bool bVar1;
  PolicyStatus PVar2;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string help;
  string local_a0;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 local_70 [32];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  undefined8 local_30;
  undefined1 *local_28;
  
  local_38 = (this->Name)._M_dataplus._M_p;
  local_40 = (this->Name)._M_string_length;
  local_50._M_len = 0x38;
  local_50._M_str = "The directory containing a CMake configuration file for ";
  local_78 = local_70;
  local_80 = 1;
  local_70[0] = 0x2e;
  local_30 = 1;
  views._M_len = 3;
  views._M_array = &local_50;
  local_28 = local_78;
  cmCatViews_abi_cxx11_(&local_a0,views);
  name = &this->Variable;
  cmMakefile::AddCacheDefinition
            ((this->super_cmFindCommon).Makefile,name,(value->_M_dataplus)._M_p,
             local_a0._M_dataplus._M_p,PATH,true);
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  if (PVar2 == NEW) {
    bVar1 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,name);
    if (bVar1) {
      value_00._M_str = (value->_M_dataplus)._M_p;
      value_00._M_len = value->_M_string_length;
      cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,name,value_00);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::SetConfigDirCacheVariable(const std::string& value)
{
  std::string const help =
    cmStrCat("The directory containing a CMake configuration file for ",
             this->Name, '.');
  this->Makefile->AddCacheDefinition(this->Variable, value, help.c_str(),
                                     cmStateEnums::PATH, true);
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW &&
      this->Makefile->IsNormalDefinitionSet(this->Variable)) {
    this->Makefile->AddDefinition(this->Variable, value);
  }
}